

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O1

Vector3 Vector3Normalize(Vector3 v)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  Vector3 VVar5;
  
  fVar4 = v.z;
  fVar1 = v.x;
  fVar3 = v.y;
  fVar2 = fVar4 * fVar4 + fVar1 * fVar1 + fVar3 * fVar3;
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  fVar2 = (float)(-(uint)(fVar2 == 0.0) & 0x3f800000 | ~-(uint)(fVar2 == 0.0) & (uint)(1.0 / fVar2))
  ;
  VVar5.y = fVar3 * fVar2;
  VVar5.x = fVar1 * fVar2;
  VVar5.z = fVar2 * fVar4;
  return VVar5;
}

Assistant:

RMDEF Vector3 Vector3Normalize(Vector3 v)
{
    Vector3 result = v;

    float length, ilength;
    length = Vector3Length(v);
    if (length == 0.0f) length = 1.0f;
    ilength = 1.0f/length;

    result.x *= ilength;
    result.y *= ilength;
    result.z *= ilength;

    return result;
}